

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageOneofFieldGenerator::GenerateParsingCode
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  Type TVar2;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  MessageOneofFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "$type_name$ subBuilder = new $type_name$();\nif ($has_property_check$) {\n  subBuilder.MergeFrom($property_name$);\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_MessageFieldGenerator).super_FieldGeneratorBase.variables_,
             local_28);
  TVar2 = FieldDescriptor::type
                    ((this->super_MessageFieldGenerator).super_FieldGeneratorBase.descriptor_);
  pPVar1 = local_18;
  if (TVar2 == TYPE_MESSAGE) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"input.ReadMessage(subBuilder);\n");
    io::Printer::Print<>(pPVar1,local_38);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"input.ReadGroup(subBuilder);\n");
    io::Printer::Print<>(pPVar1,local_48);
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,"$property_name$ = subBuilder;\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_MessageFieldGenerator).super_FieldGeneratorBase.variables_,
             local_58);
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateParsingCode(io::Printer* printer) {
  // TODO: We may be able to do better than this
  printer->Print(
    variables_,
    "$type_name$ subBuilder = new $type_name$();\n"
    "if ($has_property_check$) {\n"
    "  subBuilder.MergeFrom($property_name$);\n"
    "}\n");
  if (descriptor_->type() == FieldDescriptor::Type::TYPE_MESSAGE) {
    printer->Print("input.ReadMessage(subBuilder);\n");
  } else {
    printer->Print("input.ReadGroup(subBuilder);\n");
  }
  printer->Print(variables_, "$property_name$ = subBuilder;\n");
}